

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcols.c
# Opt level: O0

int ffgcls(fitsfile *fptr,int colnum,LONGLONG firstrow,LONGLONG firstelem,LONGLONG nelem,int nultyp,
          char *nulval,char **array,char *nularray,int *anynul,int *status)

{
  double dVar1;
  int iVar2;
  char *pcVar3;
  void *pvVar4;
  void *__ptr;
  size_t sVar5;
  ULONGLONG *array_00;
  int *exttype;
  uint in_ESI;
  int *in_RDI;
  size_t in_R8;
  int in_R9D;
  char *in_stack_00000008;
  long in_stack_00000010;
  fitsfile *in_stack_00000018;
  int *in_stack_00000028;
  ULONGLONG *ullarray;
  LONGLONG *llarray;
  double tscale;
  double *darray;
  float *earray;
  uchar byteval;
  char tmpnull [80];
  char *flgarray;
  char tmpstr [400];
  char dispfmt [20];
  char cform [20];
  char keyname [75];
  char *carray;
  char message [81];
  tcolumn *colptr;
  long jj;
  long ii;
  int equivtype;
  int dlen;
  int ll;
  int nulwidth;
  int dwidth;
  int intcol;
  int scaled;
  int tstatus;
  int hdutype;
  int tcode;
  int in_stack_00006e94;
  LONGLONG in_stack_00006e98;
  LONGLONG in_stack_00006ea0;
  LONGLONG in_stack_00006ea8;
  int in_stack_00006eb4;
  fitsfile *in_stack_00006eb8;
  int in_stack_00006ef4;
  undefined4 in_stack_00006ef8;
  float in_stack_00006efc;
  char in_stack_00006f00;
  undefined7 in_stack_00006f01;
  char *in_stack_00006f08;
  undefined4 in_stack_00006f10;
  int in_stack_00006f14;
  fitsfile *in_stack_00006f18;
  undefined4 in_stack_00006f20;
  int in_stack_00006f24;
  fitsfile *in_stack_00006f28;
  char *in_stack_00006f60;
  char **in_stack_00006f68;
  int in_stack_00006f70;
  undefined4 in_stack_00006f74;
  double *in_stack_00006f78;
  int *in_stack_00006f80;
  int *in_stack_00006f88;
  int *in_stack_00006f90;
  undefined8 in_stack_fffffffffffffc28;
  undefined4 uVar7;
  char *pcVar6;
  int *status_00;
  fitsfile *fptr_00;
  int *in_stack_fffffffffffffc50;
  LONGLONG *in_stack_fffffffffffffc58;
  LONGLONG in_stack_fffffffffffffc60;
  int value;
  int *status_01;
  char *in_stack_fffffffffffffc70;
  char *pcVar8;
  int *comm;
  double *in_stack_fffffffffffffc78;
  undefined7 in_stack_fffffffffffffc80;
  undefined1 in_stack_fffffffffffffc87;
  fitsfile *in_stack_fffffffffffffc88;
  LONGLONG *in_stack_fffffffffffffc90;
  int *in_stack_fffffffffffffc98;
  undefined4 in_stack_fffffffffffffca0;
  int in_stack_fffffffffffffca4;
  fitsfile *in_stack_fffffffffffffca8;
  int *in_stack_fffffffffffffcb0;
  char local_318 [72];
  int *in_stack_fffffffffffffd30;
  fitsfile *in_stack_fffffffffffffd38;
  int *in_stack_fffffffffffffd40;
  int *in_stack_fffffffffffffd48;
  int in_stack_fffffffffffffd54;
  fitsfile *in_stack_fffffffffffffd58;
  char local_188;
  char local_168 [120];
  void *local_f0;
  char local_e8 [88];
  long local_90;
  long local_88;
  long local_80;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  uint local_64;
  int local_60;
  int local_5c;
  undefined4 local_58;
  int local_54;
  int local_50;
  int local_4c;
  size_t local_48;
  uint local_2c;
  int *local_28;
  int local_1c;
  
  uVar7 = (undefined4)((ulong)in_stack_fffffffffffffc28 >> 0x20);
  status_01 = (int *)0x3ff0000000000000;
  if ((*in_stack_00000028 < 1) && (in_R8 != 0)) {
    local_4c = in_R9D;
    local_48 = in_R8;
    local_2c = in_ESI;
    local_28 = in_RDI;
    if (*in_RDI == *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
      if ((*(long *)(*(long *)(in_RDI + 2) + 0x88) == -1) &&
         (iVar2 = ffrdef(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30), 0 < iVar2)) {
        return *in_stack_00000028;
      }
    }
    else {
      ffmahd(in_stack_fffffffffffffca8,in_stack_fffffffffffffca4,in_stack_fffffffffffffc98,
             (int *)in_stack_fffffffffffffc90);
    }
    if (((int)local_2c < 1) || (*(int *)(*(long *)(local_28 + 2) + 0x3b0) < (int)local_2c)) {
      snprintf(local_e8,0x51,"Specified column number is out of range: %d",(ulong)local_2c);
      ffpmsg((char *)0x19dd1f);
      *in_stack_00000028 = 0x12e;
      local_1c = 0x12e;
    }
    else {
      ffeqtyll(in_stack_fffffffffffffca8,in_stack_fffffffffffffca4,in_stack_fffffffffffffc98,
               in_stack_fffffffffffffc90,(LONGLONG *)in_stack_fffffffffffffc88,
               (int *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
      if ((local_74 < 0) && (local_74 < 1)) {
        local_74 = -local_74;
      }
      local_90 = *(long *)(*(long *)(local_28 + 2) + 0x3d0) + (long)(int)(local_2c - 1) * 0xa0;
      local_50 = *(int *)(local_90 + 0x50);
      if (local_50 < 1) {
        local_50 = -local_50;
      }
      local_60 = 0;
      if (local_50 == 0x10) {
        ffgcls2(in_stack_00006f18,in_stack_00006f14,(LONGLONG)in_stack_00006f08,
                CONCAT71(in_stack_00006f01,in_stack_00006f00),
                CONCAT44(in_stack_00006efc,in_stack_00006ef8),in_stack_00006ef4,in_stack_00006f60,
                in_stack_00006f68,(char *)CONCAT44(in_stack_00006f74,in_stack_00006f70),
                (int *)in_stack_00006f78,in_stack_00006f80);
      }
      else if (local_50 == 0xe) {
        local_f0 = malloc(local_48);
        ffgcll(in_stack_00006eb8,in_stack_00006eb4,in_stack_00006ea8,in_stack_00006ea0,
               in_stack_00006e98,in_stack_00006e94,in_stack_00006f00,in_stack_00006f08,
               (char *)CONCAT44(in_stack_00006f14,in_stack_00006f10),&in_stack_00006f18->HDUposition
               ,(int *)CONCAT44(in_stack_00006f24,in_stack_00006f20));
        if (*in_stack_00000028 < 1) {
          for (local_80 = 0; local_80 < (long)local_48; local_80 = local_80 + 1) {
            if (*(char *)((long)local_f0 + local_80) == '\x01') {
              strcpy(*(char **)(in_stack_00000010 + local_80 * 8),"T");
            }
            else if (*(char *)((long)local_f0 + local_80) == '\0') {
              strcpy(*(char **)(in_stack_00000010 + local_80 * 8),"F");
            }
            else {
              strcpy(*(char **)(in_stack_00000010 + local_80 * 8),"N");
            }
          }
        }
        free(local_f0);
      }
      else if (local_50 == 0x53) {
        pcVar3 = (char *)calloc(local_48 << 1,4);
        iVar2 = (int)((ulong)in_stack_fffffffffffffc60 >> 0x20);
        pcVar6 = (char *)CONCAT44(uVar7,1);
        pcVar8 = pcVar3;
        ffgcle(in_stack_00006f28,in_stack_00006f24,(LONGLONG)in_stack_00006f18,
               CONCAT44(in_stack_00006f14,in_stack_00006f10),(LONGLONG)in_stack_00006f08,
               CONCAT71(in_stack_00006f01,in_stack_00006f00),in_stack_00006f70,in_stack_00006efc,
               (float *)in_stack_00006f78,(char *)in_stack_00006f80,in_stack_00006f88,
               in_stack_00006f90);
        if (*in_stack_00000028 < 1) {
          ffgcdw(in_stack_fffffffffffffd58,in_stack_fffffffffffffd54,in_stack_fffffffffffffd48,
                 in_stack_fffffffffffffd40);
          local_64 = (int)(local_64 - 3) / 2;
          ffkeyn((char *)status_01,iVar2,(char *)in_stack_fffffffffffffc58,in_stack_fffffffffffffc50
                );
          local_58 = 0;
          local_168[0] = '\0';
          iVar2 = ffgkys(in_stack_fffffffffffffc88,
                         (char *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                         pcVar8,in_stack_fffffffffffffc70,status_01);
          if (iVar2 == 0) {
            ffcdsp(pcVar3,pcVar6);
            if (local_188 == 'A') {
              local_168[0] = '\0';
            }
            else if (((((local_188 == 'I') || (local_188 == 'i')) || (local_188 == 'O')) ||
                     ((local_188 == 'o' || (local_188 == 'Z')))) || (local_188 == 'z')) {
              local_60 = 1;
            }
          }
          if (local_168[0] == '\0') {
            strcpy(local_168,"%14.6E");
          }
          local_88 = 0;
          for (local_80 = 0; local_80 < (long)local_48; local_80 = local_80 + 1) {
            strcpy(*(char **)(in_stack_00000010 + local_80 * 8),"(");
            if ((*(float *)(pcVar8 + local_88 * 4) != -9.11912e-36) ||
               (NAN(*(float *)(pcVar8 + local_88 * 4)))) {
              if (local_60 == 0) {
                snprintf(local_318,400,local_168,(double)*(float *)(pcVar8 + local_88 * 4));
              }
              else {
                snprintf(local_318,400,local_168,(ulong)(uint)(int)*(float *)(pcVar8 + local_88 * 4)
                        );
              }
            }
            else {
              strcpy(local_318,"NULL");
              if (local_4c == 2) {
                *(undefined1 *)((long)&in_stack_00000018->HDUposition + local_80) = 1;
              }
            }
            strncat(*(char **)(in_stack_00000010 + local_80 * 8),local_318,(long)(int)local_64);
            strcat(*(char **)(in_stack_00000010 + local_80 * 8),",");
            local_88 = local_88 + 1;
            if ((*(float *)(pcVar8 + local_88 * 4) != -9.11912e-36) ||
               (NAN(*(float *)(pcVar8 + local_88 * 4)))) {
              if (local_60 == 0) {
                snprintf(local_318,400,local_168,(double)*(float *)(pcVar8 + local_88 * 4));
              }
              else {
                snprintf(local_318,400,local_168,(ulong)(uint)(int)*(float *)(pcVar8 + local_88 * 4)
                        );
              }
            }
            else {
              strcpy(local_318,"NULL");
              if (local_4c == 2) {
                *(undefined1 *)((long)&in_stack_00000018->HDUposition + local_80) = 1;
              }
            }
            strncat(*(char **)(in_stack_00000010 + local_80 * 8),local_318,(long)(int)local_64);
            strcat(*(char **)(in_stack_00000010 + local_80 * 8),")");
            local_88 = local_88 + 1;
          }
        }
        free(pcVar8);
      }
      else if (local_50 == 0xa3) {
        pcVar3 = (char *)calloc(local_48 << 1,8);
        iVar2 = (int)((ulong)in_stack_fffffffffffffc60 >> 0x20);
        pcVar6 = (char *)CONCAT44(uVar7,1);
        pcVar8 = pcVar3;
        ffgcld(in_stack_00006f28,in_stack_00006f24,(LONGLONG)in_stack_00006f18,
               CONCAT44(in_stack_00006f14,in_stack_00006f10),(LONGLONG)in_stack_00006f08,
               CONCAT71(in_stack_00006f01,in_stack_00006f00),in_stack_00006f70,
               (double)CONCAT44(in_stack_00006efc,in_stack_00006ef8),in_stack_00006f78,
               (char *)in_stack_00006f80,in_stack_00006f88,in_stack_00006f90);
        if (*in_stack_00000028 < 1) {
          ffgcdw(in_stack_fffffffffffffd58,in_stack_fffffffffffffd54,in_stack_fffffffffffffd48,
                 in_stack_fffffffffffffd40);
          local_64 = (int)(local_64 - 3) / 2;
          ffkeyn((char *)status_01,iVar2,(char *)in_stack_fffffffffffffc58,in_stack_fffffffffffffc50
                );
          local_58 = 0;
          local_168[0] = '\0';
          iVar2 = ffgkys(in_stack_fffffffffffffc88,
                         (char *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                         (char *)in_stack_fffffffffffffc78,pcVar8,status_01);
          if (iVar2 == 0) {
            ffcdsp(pcVar3,pcVar6);
            if (local_188 == 'A') {
              local_168[0] = '\0';
            }
            else if (((local_188 == 'I') || (local_188 == 'i')) ||
                    ((local_188 == 'O' ||
                     (((local_188 == 'o' || (local_188 == 'Z')) || (local_188 == 'z')))))) {
              local_60 = 1;
            }
          }
          if (local_168[0] == '\0') {
            strcpy(local_168,"%23.15E");
          }
          local_88 = 0;
          for (local_80 = 0; local_80 < (long)local_48; local_80 = local_80 + 1) {
            strcpy(*(char **)(in_stack_00000010 + local_80 * 8),"(");
            if ((*(double *)(pcVar8 + local_88 * 8) != -9.1191291391491e-36) ||
               (NAN(*(double *)(pcVar8 + local_88 * 8)))) {
              if (local_60 == 0) {
                snprintf(local_318,400,local_168,*(undefined8 *)(pcVar8 + local_88 * 8));
              }
              else {
                snprintf(local_318,400,local_168,
                         (ulong)(uint)(int)*(double *)(pcVar8 + local_88 * 8));
              }
            }
            else {
              strcpy(local_318,"NULL");
              if (local_4c == 2) {
                *(undefined1 *)((long)&in_stack_00000018->HDUposition + local_80) = 1;
              }
            }
            strncat(*(char **)(in_stack_00000010 + local_80 * 8),local_318,(long)(int)local_64);
            strcat(*(char **)(in_stack_00000010 + local_80 * 8),",");
            local_88 = local_88 + 1;
            if ((*(double *)(pcVar8 + local_88 * 8) != -9.1191291391491e-36) ||
               (NAN(*(double *)(pcVar8 + local_88 * 8)))) {
              if (local_60 == 0) {
                snprintf(local_318,400,local_168,*(undefined8 *)(pcVar8 + local_88 * 8));
              }
              else {
                snprintf(local_318,400,local_168,
                         (ulong)(uint)(int)*(double *)(pcVar8 + local_88 * 8));
              }
            }
            else {
              strcpy(local_318,"NULL");
              if (local_4c == 2) {
                *(undefined1 *)((long)&in_stack_00000018->HDUposition + local_80) = 1;
              }
            }
            strncat(*(char **)(in_stack_00000010 + local_80 * 8),local_318,(long)(int)local_64);
            strcat(*(char **)(in_stack_00000010 + local_80 * 8),")");
            local_88 = local_88 + 1;
          }
        }
        free(pcVar8);
      }
      else if ((local_50 == 0x51) && (local_74 == 0x51)) {
        pvVar4 = calloc(local_48,8);
        iVar2 = (int)((ulong)in_stack_fffffffffffffc78 >> 0x20);
        __ptr = calloc(local_48,1);
        local_64 = 0x14;
        iVar2 = ffgcfjj((fitsfile *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                        iVar2,(LONGLONG)in_stack_fffffffffffffc70,(LONGLONG)status_01,
                        (LONGLONG)pvVar4,in_stack_fffffffffffffc58,
                        (char *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                        &in_stack_fffffffffffffca8->HDUposition,in_stack_fffffffffffffcb0);
        if (0 < iVar2) {
          free(__ptr);
          free(pvVar4);
          return *in_stack_00000028;
        }
        if (in_stack_00000008 == (char *)0x0) {
          strcpy(&stack0xfffffffffffffc88," ");
          local_68 = 1;
        }
        else {
          strncpy(&stack0xfffffffffffffc88,in_stack_00000008,0x4f);
          sVar5 = strlen(&stack0xfffffffffffffc88);
          local_68 = (int)sVar5;
        }
        for (local_80 = 0; local_80 < (long)local_48; local_80 = local_80 + 1) {
          if (*(char *)((long)__ptr + local_80) == '\0') {
            snprintf(local_318,400,"%20lld",*(undefined8 *)((long)pvVar4 + local_80 * 8));
            **(undefined1 **)(in_stack_00000010 + local_80 * 8) = 0;
            strncat(*(char **)(in_stack_00000010 + local_80 * 8),local_318,0x14);
          }
          else {
            **(undefined1 **)(in_stack_00000010 + local_80 * 8) = 0;
            if ((int)local_64 < local_68) {
              strncat(*(char **)(in_stack_00000010 + local_80 * 8),&stack0xfffffffffffffc88,
                      (long)(int)local_64);
            }
            else {
              sprintf(*(char **)(in_stack_00000010 + local_80 * 8),"%*s",(ulong)local_64,
                      &stack0xfffffffffffffc88);
            }
            if (local_4c == 2) {
              *(undefined1 *)((long)&in_stack_00000018->HDUposition + local_80) = 1;
            }
          }
        }
        free(__ptr);
        free(pvVar4);
      }
      else if ((local_50 == 0x51) && (local_74 == 0x50)) {
        array_00 = (ULONGLONG *)calloc(local_48,8);
        iVar2 = (int)((ulong)in_stack_fffffffffffffc78 >> 0x20);
        pvVar4 = calloc(local_48,1);
        local_64 = 0x14;
        iVar2 = ffgcfujj((fitsfile *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                         iVar2,(LONGLONG)in_stack_fffffffffffffc70,(LONGLONG)status_01,
                         in_stack_fffffffffffffc60,array_00,
                         (char *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                         &in_stack_fffffffffffffca8->HDUposition,in_stack_fffffffffffffcb0);
        if (0 < iVar2) {
          free(pvVar4);
          free(array_00);
          return *in_stack_00000028;
        }
        if (in_stack_00000008 == (char *)0x0) {
          strcpy(&stack0xfffffffffffffc88," ");
          local_68 = 1;
        }
        else {
          strncpy(&stack0xfffffffffffffc88,in_stack_00000008,0x4f);
          sVar5 = strlen(&stack0xfffffffffffffc88);
          local_68 = (int)sVar5;
        }
        for (local_80 = 0; local_80 < (long)local_48; local_80 = local_80 + 1) {
          if (*(char *)((long)pvVar4 + local_80) == '\0') {
            snprintf(local_318,400,"%20llu",array_00[local_80]);
            **(undefined1 **)(in_stack_00000010 + local_80 * 8) = 0;
            strncat(*(char **)(in_stack_00000010 + local_80 * 8),local_318,0x14);
          }
          else {
            **(undefined1 **)(in_stack_00000010 + local_80 * 8) = 0;
            if ((int)local_64 < local_68) {
              strncat(*(char **)(in_stack_00000010 + local_80 * 8),&stack0xfffffffffffffc88,
                      (long)(int)local_64);
            }
            else {
              sprintf(*(char **)(in_stack_00000010 + local_80 * 8),"%*s",(ulong)local_64,
                      &stack0xfffffffffffffc88);
            }
            if (local_4c == 2) {
              *(undefined1 *)((long)&in_stack_00000018->HDUposition + local_80) = 1;
            }
          }
        }
        free(pvVar4);
        free(array_00);
      }
      else {
        exttype = (int *)calloc(local_48,8);
        value = (int)((ulong)in_stack_fffffffffffffc60 >> 0x20);
        status_00 = (int *)CONCAT44(uVar7,local_4c);
        fptr_00 = in_stack_00000018;
        comm = exttype;
        iVar2 = ffgcld(in_stack_00006f28,in_stack_00006f24,(LONGLONG)in_stack_00006f18,
                       CONCAT44(in_stack_00006f14,in_stack_00006f10),(LONGLONG)in_stack_00006f08,
                       CONCAT71(in_stack_00006f01,in_stack_00006f00),in_stack_00006f70,
                       (double)CONCAT44(in_stack_00006efc,in_stack_00006ef8),in_stack_00006f78,
                       (char *)in_stack_00006f80,in_stack_00006f88,in_stack_00006f90);
        if (0 < iVar2) {
          free(comm);
          return *in_stack_00000028;
        }
        ffgcdw(in_stack_fffffffffffffd58,in_stack_fffffffffffffd54,in_stack_fffffffffffffd48,
               in_stack_fffffffffffffd40);
        ffkeyn((char *)status_01,value,(char *)in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
        local_58 = 0;
        local_5c = 0;
        iVar2 = ffgkyd(in_stack_fffffffffffffc88,
                       (char *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                       in_stack_fffffffffffffc78,(char *)comm,status_01);
        if ((iVar2 == 0) && (((double)status_01 != 1.0 || (NAN((double)status_01))))) {
          local_5c = 1;
        }
        local_60 = 0;
        if ((local_50 < 0x2a) && (local_5c == 0)) {
          local_60 = 1;
        }
        ffkeyn((char *)status_01,value,(char *)in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
        local_58 = 0;
        local_168[0] = '\0';
        iVar2 = ffgkys(in_stack_fffffffffffffc88,
                       (char *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                       (char *)in_stack_fffffffffffffc78,(char *)comm,status_01);
        if (iVar2 == 0) {
          ffcdsp((char *)exttype,(char *)status_00);
          if (local_188 == 'A') {
            local_168[0] = '\0';
          }
          else if (((((local_188 == 'I') || (local_188 == 'i')) || (local_188 == 'O')) ||
                   ((local_188 == 'o' || (local_188 == 'Z')))) || (local_188 == 'z')) {
            local_60 = 1;
          }
        }
        if (local_168[0] == '\0') {
          ffkeyn((char *)status_01,value,(char *)in_stack_fffffffffffffc58,in_stack_fffffffffffffc50
                );
          ffgkys(in_stack_fffffffffffffc88,
                 (char *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                 (char *)in_stack_fffffffffffffc78,(char *)comm,status_01);
          if ((local_5c == 0) || (0x15 < local_50)) {
            if ((local_5c == 0) || (local_50 != 0x29)) {
              if ((local_5c == 0) || (local_50 != 0x51)) {
                ffghdt(fptr_00,exttype,status_00);
                if (local_54 == 1) {
                  ffcdsp((char *)exttype,(char *)status_00);
                }
                else if (local_50 == 1) {
                  strcpy(local_168,"%4d");
                }
                else if (local_50 == 0xb) {
                  strcpy(local_168,"%4d");
                }
                else if (local_50 == 0x15) {
                  strcpy(local_168,"%6d");
                }
                else if (local_50 == 0x29) {
                  strcpy(local_168,"%11.0f");
                  local_60 = 0;
                }
                else if (local_50 == 0x2a) {
                  strcpy(local_168,"%#14.6G");
                }
                else if (local_50 == 0x52) {
                  strcpy(local_168,"%#23.15G");
                }
              }
              else {
                strcpy(local_168,"%#23.15G");
              }
            }
            else {
              strcpy(local_168,"%#23.15G");
            }
          }
          else {
            strcpy(local_168,"%#14.6G");
          }
        }
        if (in_stack_00000008 == (char *)0x0) {
          strcpy(&stack0xfffffffffffffc88," ");
          local_68 = 1;
        }
        else {
          strncpy(&stack0xfffffffffffffc88,in_stack_00000008,0x4f);
          sVar5 = strlen(&stack0xfffffffffffffc88);
          local_68 = (int)sVar5;
        }
        for (local_80 = 0; local_80 < (long)local_48; local_80 = local_80 + 1) {
          if (local_50 == 1) {
            dVar1 = *(double *)(comm + local_80 * 2);
            for (local_6c = 0; local_6c < 8; local_6c = local_6c + 1) {
              if ((int)(((int)dVar1 & 0xffU) << ((byte)local_6c & 0x1f) & 0xff) >> 7 == 0) {
                *(undefined1 *)(*(long *)(in_stack_00000010 + local_80 * 8) + (long)local_6c) = 0x30
                ;
              }
              else {
                *(undefined1 *)(*(long *)(in_stack_00000010 + local_80 * 8) + (long)local_6c) = 0x31
                ;
              }
            }
            *(undefined1 *)(*(long *)(in_stack_00000010 + local_80 * 8) + 8) = 0;
          }
          else if ((((local_4c == 1) && (*(double *)(comm + local_80 * 2) == -9.1191291391491e-36))
                   && (!NAN(*(double *)(comm + local_80 * 2)))) ||
                  ((local_4c == 2 &&
                   (*(char *)((long)&in_stack_00000018->HDUposition + local_80) != '\0')))) {
            **(undefined1 **)(in_stack_00000010 + local_80 * 8) = 0;
            if ((int)local_64 < local_68) {
              strncat(*(char **)(in_stack_00000010 + local_80 * 8),&stack0xfffffffffffffc88,
                      (long)(int)local_64);
            }
            else {
              sprintf(*(char **)(in_stack_00000010 + local_80 * 8),"%*s",(ulong)local_64,
                      &stack0xfffffffffffffc88);
            }
          }
          else {
            if (local_60 == 0) {
              snprintf(local_318,400,local_168,*(undefined8 *)(comm + local_80 * 2));
            }
            else {
              snprintf(local_318,400,local_168,(ulong)(uint)(int)*(double *)(comm + local_80 * 2));
            }
            sVar5 = strlen(local_318);
            local_70 = (int)sVar5;
            if ((int)local_64 < local_70) {
              memset(local_318,0x2a,(long)(int)local_64);
            }
            **(undefined1 **)(in_stack_00000010 + local_80 * 8) = 0;
            strncat(*(char **)(in_stack_00000010 + local_80 * 8),local_318,(long)(int)local_64);
          }
        }
        free(comm);
      }
      local_1c = *in_stack_00000028;
    }
  }
  else {
    local_1c = *in_stack_00000028;
  }
  return local_1c;
}

Assistant:

int ffgcls( fitsfile *fptr,   /* I - FITS file pointer                       */
            int  colnum,      /* I - number of column to read (1 = 1st col) */
            LONGLONG  firstrow,   /* I - first row to read (1 = 1st row)        */
            LONGLONG  firstelem,  /* I - first vector element to read (1 = 1st) */
            LONGLONG  nelem,      /* I - number of strings to read              */
            int   nultyp,     /* I - null value handling code:               */
                              /*     1: set undefined pixels = nulval        */
                              /*     2: set nularray=1 for undefined pixels  */
            char  *nulval,    /* I - value for null pixels if nultyp = 1     */
            char **array,     /* O - array of values that are read           */
            char *nularray,   /* O - array of flags = 1 if nultyp = 2        */
            int  *anynul,     /* O - set to 1 if any values are null; else 0 */
            int  *status)     /* IO - error status                           */
/*
  Read an array of string values from a column in the current FITS HDU.
  Returns a formated string value, regardless of the datatype of the column
*/
{
    int tcode, hdutype, tstatus, scaled, intcol, dwidth, nulwidth, ll, dlen;
    int equivtype;
    long ii, jj;
    tcolumn *colptr;
    char message[FLEN_ERRMSG], *carray, keyname[FLEN_KEYWORD];
    char cform[20], dispfmt[20], tmpstr[400], *flgarray, tmpnull[80];
    unsigned char byteval;
    float *earray;
    double *darray, tscale = 1.0;
    LONGLONG *llarray;
    ULONGLONG *ullarray;

    if (*status > 0 || nelem == 0)  /* inherit input status value if > 0 */
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    /* rescan header if data structure is undefined */
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               
            return(*status);

    if (colnum < 1 || colnum > (fptr->Fptr)->tfield)
    {
        snprintf(message, FLEN_ERRMSG,"Specified column number is out of range: %d",
                colnum);
        ffpmsg(message);
        return(*status = BAD_COL_NUM);
    }

    /* get equivalent dataype of column (only needed for TLONGLONG columns) */
    ffeqtyll(fptr, colnum, &equivtype, NULL, NULL, status);
    if (equivtype < 0) equivtype = abs(equivtype);
    
    colptr  = (fptr->Fptr)->tableptr;   /* point to first column */
    colptr += (colnum - 1);     /* offset to correct column structure */
    tcode = abs(colptr->tdatatype);

    intcol = 0;
    if (tcode == TSTRING)
    {
      /* simply call the string column reading routine */
      ffgcls2(fptr, colnum, firstrow, firstelem, nelem, nultyp, nulval,
           array, nularray, anynul, status);
    }
    else if (tcode == TLOGICAL)
    {
      /* allocate memory for the array of logical values */
      carray = (char *) malloc((size_t) nelem);

      /*  call the logical column reading routine */
      ffgcll(fptr, colnum, firstrow, firstelem, nelem, nultyp, *nulval,
           carray, nularray, anynul, status); 

      if (*status <= 0)
      {
         /* convert logical values to "T", "F", or "N" (Null) */
         for (ii = 0; ii < nelem; ii++)
         {
           if (carray[ii] == 1)
              strcpy(array[ii], "T");
           else if (carray[ii] == 0)
              strcpy(array[ii], "F");
           else  /* undefined values = 2 */
              strcpy(array[ii],"N");
         }
      }

      free(carray);  /* free the memory */
    }
    else if (tcode == TCOMPLEX)
    {
      /* allocate memory for the array of double values */
      earray = (float *) calloc((size_t) (nelem * 2), sizeof(float) );
      
      ffgcle(fptr, colnum, firstrow, (firstelem - 1) * 2 + 1, nelem * 2,
        1, 1, FLOATNULLVALUE, earray, nularray, anynul, status);

      if (*status <= 0)
      {

         /* determine the format for the output strings */

         ffgcdw(fptr, colnum, &dwidth, status);
         dwidth = (dwidth - 3) / 2;
 
         /* use the TDISPn keyword if it exists */
         ffkeyn("TDISP", colnum, keyname, status);
         tstatus = 0;
         cform[0] = '\0';

         if (ffgkys(fptr, keyname, dispfmt, NULL, &tstatus) == 0)
         {
             /* convert the Fortran style format to a C style format */
             ffcdsp(dispfmt, cform);

	     /* Special case: TDISPn='Aw' disallowed for numeric types */
	     if (dispfmt[0] == 'A') {
	       cform[0] = 0;

	       /* Special case: if the output is intended to be represented
		  as an integer, but we read it as a double, we need to
		  set intcol = 1 so it is printed as an integer */
	     } else if ((dispfmt[0] == 'I') || (dispfmt[0] == 'i') ||
			(dispfmt[0] == 'O') || (dispfmt[0] == 'o') ||
			(dispfmt[0] == 'Z') || (dispfmt[0] == 'z')) {
	       intcol = 1;
	     }
         }

         if (!cform[0])
             strcpy(cform, "%14.6E");

         /* write the formated string for each value:  "(real,imag)" */
         jj = 0;
         for (ii = 0; ii < nelem; ii++)
         {
           strcpy(array[ii], "(");

           /* test for null value */
           if (earray[jj] == FLOATNULLVALUE)
           {
             strcpy(tmpstr, "NULL");
             if (nultyp == 2)
                nularray[ii] = 1;
           }
           else if (intcol)
	   {
	       snprintf(tmpstr, 400,cform, (int) earray[jj]);
	   } 
	   else 
	   {
	       snprintf(tmpstr, 400,cform, earray[jj]);
	   }

           strncat(array[ii], tmpstr, dwidth);
           strcat(array[ii], ",");
           jj++;

           /* test for null value */
           if (earray[jj] == FLOATNULLVALUE)
           {
             strcpy(tmpstr, "NULL");
             if (nultyp == 2)
                nularray[ii] = 1;
           }
           else if (intcol)
	   {
	       snprintf(tmpstr, 400,cform, (int) earray[jj]);
	   } 
	   else 
	   {
	       snprintf(tmpstr, 400,cform, earray[jj]);
	   }

           strncat(array[ii], tmpstr, dwidth);
           strcat(array[ii], ")");
           jj++;
         }
      }

      free(earray);  /* free the memory */
    }
    else if (tcode == TDBLCOMPLEX)
    {
      /* allocate memory for the array of double values */
      darray = (double *) calloc((size_t) (nelem * 2), sizeof(double) );
      
      ffgcld(fptr, colnum, firstrow, (firstelem - 1) * 2 + 1, nelem * 2,
        1, 1, DOUBLENULLVALUE, darray, nularray, anynul, status);

      if (*status <= 0)
      {
         /* determine the format for the output strings */

         ffgcdw(fptr, colnum, &dwidth, status);
         dwidth = (dwidth - 3) / 2;

         /* use the TDISPn keyword if it exists */
         ffkeyn("TDISP", colnum, keyname, status);
         tstatus = 0;
         cform[0] = '\0';
 
         if (ffgkys(fptr, keyname, dispfmt, NULL, &tstatus) == 0)
         {
             /* convert the Fortran style format to a C style format */
             ffcdsp(dispfmt, cform);

	     /* Special case: TDISPn='Aw' disallowed for numeric types */
	     if (dispfmt[0] == 'A') {
	       cform[0] = 0;

	       /* Special case: if the output is intended to be represented
		  as an integer, but we read it as a double, we need to
		  set intcol = 1 so it is printed as an integer */
	     } else if ((dispfmt[0] == 'I') || (dispfmt[0] == 'i') ||
			(dispfmt[0] == 'O') || (dispfmt[0] == 'o') ||
			(dispfmt[0] == 'Z') || (dispfmt[0] == 'z')) {
	       intcol = 1;
	     }
         }

         if (!cform[0])
            strcpy(cform, "%23.15E");

         /* write the formated string for each value:  "(real,imag)" */
         jj = 0;
         for (ii = 0; ii < nelem; ii++)
         {
           strcpy(array[ii], "(");

           /* test for null value */
           if (darray[jj] == DOUBLENULLVALUE)
           {
             strcpy(tmpstr, "NULL");
             if (nultyp == 2)
                nularray[ii] = 1;
           }
           else if (intcol)
	   {
	       snprintf(tmpstr, 400,cform, (int) darray[jj]);
	   } 
	   else 
	   {
	       snprintf(tmpstr, 400,cform, darray[jj]);
	   }

           strncat(array[ii], tmpstr, dwidth);
           strcat(array[ii], ",");
           jj++;

           /* test for null value */
           if (darray[jj] == DOUBLENULLVALUE)
           {
             strcpy(tmpstr, "NULL");
             if (nultyp == 2)
                nularray[ii] = 1;
           }
           else if (intcol)
	   {
	       snprintf(tmpstr, 400,cform, (int) darray[jj]);
	   } 
	   else 
	   {
	       snprintf(tmpstr, 400,cform, darray[jj]);
	   }

           strncat(array[ii], tmpstr, dwidth);
           strcat(array[ii], ")");
           jj++;
         }
      }

      free(darray);  /* free the memory */
    }
    else if (tcode == TLONGLONG && equivtype == TLONGLONG)
    {
      /* allocate memory for the array of LONGLONG values */
      llarray = (LONGLONG *) calloc((size_t) nelem, sizeof(LONGLONG) );
      flgarray = (char *) calloc((size_t) nelem, sizeof(char) );
      dwidth = 20;  /* max width of displayed long long integer value */

      if (ffgcfjj(fptr, colnum, firstrow, firstelem, nelem,
            llarray, flgarray, anynul, status) > 0)
      {
         free(flgarray);
         free(llarray);
         return(*status);
      }

      /* write the formated string for each value */
      if (nulval) {
          strncpy(tmpnull, nulval,79);
          tmpnull[79]='\0'; /* In case len(nulval) >= 79 */
          nulwidth = strlen(tmpnull);
      } else {
          strcpy(tmpnull, " ");
          nulwidth = 1;
      }

      for (ii = 0; ii < nelem; ii++)
      {
           if ( flgarray[ii] )
           {
              *array[ii] = '\0';
              if (dwidth < nulwidth)
                  strncat(array[ii], tmpnull, dwidth);
              else
                  sprintf(array[ii],"%*s",dwidth,tmpnull);
		  
              if (nultyp == 2)
	          nularray[ii] = 1;
           }
           else
           {	   

#if defined(_MSC_VER)
    /* Microsoft Visual C++ 6.0 uses '%I64d' syntax  for 8-byte integers */
        snprintf(tmpstr, 400,"%20I64d", llarray[ii]);
#elif (USE_LL_SUFFIX == 1)
        snprintf(tmpstr, 400,"%20lld", llarray[ii]);
#else
        snprintf(tmpstr, 400,"%20ld", llarray[ii]);
#endif
              *array[ii] = '\0';
              strncat(array[ii], tmpstr, 20);
           }
      }

      free(flgarray);
      free(llarray);  /* free the memory */

    }
    else if (tcode == TLONGLONG && equivtype == TULONGLONG)
    {
      /* allocate memory for the array of ULONGLONG values */
      ullarray = (ULONGLONG *) calloc((size_t) nelem, sizeof(ULONGLONG) );
      flgarray = (char *) calloc((size_t) nelem, sizeof(char) );
      dwidth = 20;  /* max width of displayed unsigned long long integer value */

      if (ffgcfujj(fptr, colnum, firstrow, firstelem, nelem,
            ullarray, flgarray, anynul, status) > 0)
      {
         free(flgarray);
         free(ullarray);
         return(*status);
      }

      /* write the formated string for each value */
      if (nulval) {
          strncpy(tmpnull, nulval, 79);
          tmpnull[79]='\0'; /* In case len(nulval) >= 79 */
          nulwidth = strlen(tmpnull);
      } else {
          strcpy(tmpnull, " ");
          nulwidth = 1;
      }

      for (ii = 0; ii < nelem; ii++)
      {
           if ( flgarray[ii] )
           {
              *array[ii] = '\0';
              if (dwidth < nulwidth)
                  strncat(array[ii], tmpnull, dwidth);
              else
                  sprintf(array[ii],"%*s",dwidth,tmpnull);
		  
              if (nultyp == 2)
	          nularray[ii] = 1;
           }
           else
           {	   

#if defined(_MSC_VER)
    /* Microsoft Visual C++ 6.0 uses '%I64d' syntax  for 8-byte integers */
        snprintf(tmpstr, 400, "%20I64u", ullarray[ii]); 
#elif (USE_LL_SUFFIX == 1)
        snprintf(tmpstr, 400, "%20llu", ullarray[ii]);
#else
        snprintf(tmpstr, 400, "%20lu", ullarray[ii]);
#endif
              *array[ii] = '\0';
              strncat(array[ii], tmpstr, 20);
           }
      }

      free(flgarray);
      free(ullarray);  /* free the memory */

    }
    else
    {
      /* allocate memory for the array of double values */
      darray = (double *) calloc((size_t) nelem, sizeof(double) );
      
      /* read all other numeric type columns as doubles */
      if (ffgcld(fptr, colnum, firstrow, firstelem, nelem, 1, nultyp, 
           DOUBLENULLVALUE, darray, nularray, anynul, status) > 0)
      {
         free(darray);
         return(*status);
      }

      /* determine the format for the output strings */

      ffgcdw(fptr, colnum, &dwidth, status);

      /* check if  column is scaled */
      ffkeyn("TSCAL", colnum, keyname, status);
      tstatus = 0;
      scaled = 0;
      if (ffgkyd(fptr, keyname, &tscale, NULL, &tstatus) == 0)
      {
            if (tscale != 1.0)
                scaled = 1;    /* yes, this is a scaled column */
      }

      intcol = 0;
      if (tcode <= TLONG && !scaled)
             intcol = 1;   /* this is an unscaled integer column */

      /* use the TDISPn keyword if it exists */
      ffkeyn("TDISP", colnum, keyname, status);
      tstatus = 0;
      cform[0] = '\0';

      if (ffgkys(fptr, keyname, dispfmt, NULL, &tstatus) == 0)
      {
           /* convert the Fortran style TDISPn to a C style format */
           ffcdsp(dispfmt, cform);

	   /* Special case: TDISPn='Aw' disallowed for numeric types */
	   if (dispfmt[0] == 'A') {
	     cform[0] = 0;

	   /* Special case: if the output is intended to be represented
	      as an integer, but we read it as a double, we need to
	      set intcol = 1 so it is printed as an integer */
	   } else if ((dispfmt[0] == 'I') || (dispfmt[0] == 'i') ||
		      (dispfmt[0] == 'O') || (dispfmt[0] == 'o') ||
		      (dispfmt[0] == 'Z') || (dispfmt[0] == 'z')) {
	     intcol = 1;
	   }
      }

      if (!cform[0])
      {
            /* no TDISPn keyword; use TFORMn instead */

            ffkeyn("TFORM", colnum, keyname, status);
            ffgkys(fptr, keyname, dispfmt, NULL, status);

            if (scaled && tcode <= TSHORT)
            {
                  /* scaled short integer column == float */
                  strcpy(cform, "%#14.6G");
            }
            else if (scaled && tcode == TLONG)
            {
                  /* scaled long integer column == double */
                  strcpy(cform, "%#23.15G");
            }
            else if (scaled && tcode == TLONGLONG)
            {
                  /* scaled long long integer column == double */
                  strcpy(cform, "%#23.15G");
            }
            else
            {
               ffghdt(fptr, &hdutype, status);
               if (hdutype == ASCII_TBL)
               {
                  /* convert the Fortran style TFORMn to a C style format */
                  ffcdsp(dispfmt, cform);
               }
               else
               {
                 /* this is a binary table, need to convert the format */
                  if (tcode == TBIT) {            /* 'X' */
                     strcpy(cform, "%4d");
                  } else if (tcode == TBYTE) {    /* 'B' */
                     strcpy(cform, "%4d");
                  } else if (tcode == TSHORT) {   /* 'I' */
                     strcpy(cform, "%6d");
                  } else if (tcode == TLONG) {    /* 'J' */
                     strcpy(cform, "%11.0f");
                     intcol = 0;  /* needed to support unsigned int */
                  } else if (tcode == TFLOAT) {   /* 'E' */
                     strcpy(cform, "%#14.6G");
                  } else if (tcode == TDOUBLE) {  /* 'D' */
                     strcpy(cform, "%#23.15G");
                  }
               }
            }
      } 

      if (nulval) {
          strncpy(tmpnull, nulval,79);
          tmpnull[79]='\0';
          nulwidth = strlen(tmpnull);
      } else {
          strcpy(tmpnull, " ");
          nulwidth = 1;
      }

      /* write the formated string for each value */
      for (ii = 0; ii < nelem; ii++)
      {
           if (tcode == TBIT)
           {
               byteval = (unsigned char) darray[ii];

               for (ll=0; ll < 8; ll++)
               {
                   if ( ((unsigned char) (byteval << ll)) >> 7 )
                       *(array[ii] + ll) = '1';
                   else
                       *(array[ii] + ll) = '0';
               }
               *(array[ii] + 8) = '\0';
           }
           /* test for null value */
           else if ( (nultyp == 1 && darray[ii] == DOUBLENULLVALUE) ||
                (nultyp == 2 && nularray[ii]) )
           {
              *array[ii] = '\0';
              if (dwidth < nulwidth)
                  strncat(array[ii], tmpnull, dwidth);
              else
                  sprintf(array[ii],"%*s",dwidth,tmpnull);
           }
           else
           {	   
              if (intcol) {
                snprintf(tmpstr, 400,cform, (int) darray[ii]);
              } else {
                snprintf(tmpstr, 400,cform, darray[ii]);
              }
	      
              /* fill field with '*' if number is too wide */
              dlen = strlen(tmpstr);
	      if (dlen > dwidth) {
	         memset(tmpstr, '*', dwidth);
              }

              *array[ii] = '\0';
              strncat(array[ii], tmpstr, dwidth);
           }
      }

      free(darray);  /* free the memory */
    }
    return(*status);
}